

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CompressedTextureSubImage<1u>
          (CompressedSubImageTest *this,GLint internalformat)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_1f0;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLenum error;
  Functions *gl;
  CompressedSubImageTest *pCStack_18;
  GLint internalformat_local;
  CompressedSubImageTest *this_local;
  
  gl._4_4_ = internalformat;
  pCStack_18 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  if (this->m_reference_size == 0) {
    this_local._7_1_ = true;
  }
  else {
    (**(code **)(lStack_28 + 0x2d8))
              (this->m_to,0,0,4,gl._4_4_,this->m_reference_size,this->m_reference);
    local_2c = (**(code **)(lStack_28 + 0x800))();
    if (local_2c == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (char (*) [60])
                          "glCompressedTextureSubImage1D unexpectedly generated error ");
      EVar4 = glu::getErrorStr(local_2c);
      local_1e0 = EVar4.m_getName;
      local_1d8 = EVar4.m_value;
      local_1d0[0].m_getName = local_1e0;
      local_1d0[0].m_value = local_1d8;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [39])" during the test with internal format ");
      EVar4 = glu::getTextureFormatStr(gl._4_4_);
      local_1f0.m_getName = EVar4.m_getName;
      local_1f0.m_value = EVar4.m_value;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f0);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])0x2a7696c);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompressedSubImageTest::CompressedTextureSubImage<1>(glw::GLint internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Load texture image with tested function. */
	if (m_reference_size)
	{
		gl.compressedTextureSubImage1D(m_to, 0, 0, s_texture_width, internalformat, m_reference_size, m_reference);
	}
	else
	{
		/* For 1D version there is no specific compressed texture internal format spcified in OpenGL 4.5 core profile documentation.
		 Only implementation depended specific internalformats may provide this functionality. As a result there may be no reference data to be substituted.
		 Due to this reason there is no use of CompressedTextureSubImage1D and particulary it cannot be tested. */
		return true;
	}

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glCompressedTextureSubImage1D unexpectedly generated error "
			<< glu::getErrorStr(error) << " during the test with internal format "
			<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}